

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void __thiscall
ParserCallbacks::handleObject
          (ParserCallbacks *this,QPDFObjectHandle *obj,size_t offset,size_t length)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  ulong uVar5;
  bool local_c1;
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [55];
  byte local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  size_t local_28;
  size_t length_local;
  size_t offset_local;
  QPDFObjectHandle *obj_local;
  ParserCallbacks *this_local;
  
  local_28 = length;
  length_local = offset;
  offset_local = (size_t)obj;
  obj_local = (QPDFObjectHandle *)this;
  uVar1 = QPDFObjectHandle::isName();
  local_49 = 0;
  local_c1 = false;
  if ((uVar1 & 1) != 0) {
    QPDFObjectHandle::getName_abi_cxx11_();
    local_49 = 1;
    local_c1 = std::operator==(&local_48,"/Abort");
  }
  if ((local_49 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_48);
  }
  if (local_c1 != false) {
    poVar4 = std::operator<<((ostream *)&std::cout,"test suite: terminating parsing");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    QPDFObjectHandle::ParserCallbacks::terminateParsing();
  }
  pcVar3 = (char *)QPDFObjectHandle::getTypeName();
  poVar4 = std::operator<<((ostream *)&std::cout,pcVar3);
  poVar4 = std::operator<<(poVar4,", offset=");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,length_local);
  poVar4 = std::operator<<(poVar4,", length=");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_28);
  std::operator<<(poVar4,": ");
  uVar5 = QPDFObjectHandle::isInlineImage();
  if ((uVar5 & 1) == 0) {
    QPDFObjectHandle::unparse_abi_cxx11_();
    poVar4 = std::operator<<((ostream *)&std::cout,local_c0);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_c0);
  }
  else {
    iVar2 = QPDFObjectHandle::getTypeCode();
    if (iVar2 != 0xc) {
      __assert_fail("obj.getTypeCode() == ::ot_inlineimage",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x78,
                    "virtual void ParserCallbacks::handleObject(QPDFObjectHandle, size_t, size_t)");
    }
    QPDFObjectHandle::getInlineImageValue_abi_cxx11_();
    QUtil::hex_encode(local_80);
    poVar4 = std::operator<<((ostream *)&std::cout,local_80);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string(local_a0);
  }
  return;
}

Assistant:

void
ParserCallbacks::handleObject(QPDFObjectHandle obj, size_t offset, size_t length)
{
    if (obj.isName() && (obj.getName() == "/Abort")) {
        std::cout << "test suite: terminating parsing" << std::endl;
        terminateParsing();
    }
    std::cout << obj.getTypeName() << ", offset=" << offset << ", length=" << length << ": ";
    if (obj.isInlineImage()) {
        // Exercise getTypeCode
        assert(obj.getTypeCode() == ::ot_inlineimage);
        std::cout << QUtil::hex_encode(obj.getInlineImageValue()) << std::endl;
    } else {
        std::cout << obj.unparse() << std::endl;
    }
}